

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O2

tuple<int,_int> __thiscall Maze::adjacentCells(Maze *this,int row,int column)

{
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *this_00;
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  uint in_ECX;
  uint uVar4;
  ulong uVar5;
  size_type sVar6;
  undefined4 in_register_00000034;
  long lVar7;
  uint uVar8;
  reference rVar9;
  
  lVar7 = CONCAT44(in_register_00000034,row);
  uVar5 = (ulong)(int)(column + 1U);
  this_00 = (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             *)(lVar7 + 0x58);
  sVar6 = (size_type)(int)in_ECX;
  uVar4 = in_ECX;
  if (uVar5 < (ulong)((*(long *)(lVar7 + 0x60) - *(long *)(lVar7 + 0x58)) / 0x18)) {
    pvVar1 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(this_00,uVar5);
    pvVar2 = std::vector<char,_std::allocator<char>_>::at(pvVar1,sVar6);
    if (*pvVar2 == '0') {
      pvVar3 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::at((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     *)(lVar7 + 0x88),uVar5);
      rVar9 = std::vector<bool,_std::allocator<bool>_>::at(pvVar3,sVar6);
      uVar8 = column + 1U;
      if ((*rVar9._M_p & rVar9._M_mask) == 0) goto LAB_00102d1a;
    }
  }
  if (0 < column) {
    uVar8 = column - 1;
    pvVar1 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(this_00,(ulong)uVar8);
    pvVar2 = std::vector<char,_std::allocator<char>_>::at(pvVar1,sVar6);
    if (*pvVar2 == '0') {
      pvVar3 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::at((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     *)(lVar7 + 0x88),(ulong)uVar8);
      rVar9 = std::vector<bool,_std::allocator<bool>_>::at(pvVar3,sVar6);
      if ((*rVar9._M_p & rVar9._M_mask) == 0) goto LAB_00102d1a;
    }
  }
  sVar6 = (size_type)column;
  uVar8 = column;
  if (0 < (int)in_ECX) {
    pvVar1 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(this_00,sVar6);
    uVar4 = in_ECX - 1;
    pvVar2 = std::vector<char,_std::allocator<char>_>::at(pvVar1,(ulong)uVar4);
    if (*pvVar2 == '0') {
      pvVar3 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::at((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     *)(lVar7 + 0x88),sVar6);
      rVar9 = std::vector<bool,_std::allocator<bool>_>::at(pvVar3,(ulong)uVar4);
      if ((*rVar9._M_p & rVar9._M_mask) == 0) goto LAB_00102d1a;
    }
  }
  uVar5 = (ulong)(int)(in_ECX + 1);
  pvVar1 = std::
           vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ::at(this_00,sVar6);
  if (uVar5 < (ulong)((long)(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_start)) {
    pvVar1 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(this_00,sVar6);
    pvVar2 = std::vector<char,_std::allocator<char>_>::at(pvVar1,uVar5);
    if (*pvVar2 == '0') {
      pvVar3 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::at((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     *)(lVar7 + 0x88),sVar6);
      rVar9 = std::vector<bool,_std::allocator<bool>_>::at(pvVar3,uVar5);
      uVar4 = in_ECX + 1;
      if ((*rVar9._M_p & rVar9._M_mask) == 0) goto LAB_00102d1a;
    }
  }
  uVar8 = 0xffffffff;
  uVar4 = 0xffffffff;
LAB_00102d1a:
  *(uint *)&(this->pathStack).c.
            super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
            super__Deque_impl_data._M_map = uVar4;
  *(uint *)((long)&(this->pathStack).c.
                   super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                   _M_impl.super__Deque_impl_data._M_map + 4) = uVar8;
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int, int> Maze::adjacentCells (int row, int column){
    //if theirs a successor return it's index, otherwise return somthing invalid.

    std::tuple<int, int> NoSuccessor = std::make_tuple(-1,-1);
    if(row+1<MazeMatrix.size() && MazeMatrix.at(row+1).at(column) == '0'&& !used.at(row+1).at(column)) {
        return std::make_tuple(row+1, column);
        //checking vertical down
    }
    else if(row >= 1 && MazeMatrix.at(row-1).at(column) == '0' && !used.at(row-1).at(column)){
        return std::make_tuple(row-1, column);
        //checking vertical up
    }
    //
    else if(column >= 1 && MazeMatrix.at(row).at(column -1) == '0' && !used.at(row).at(column-1)){
        return std::make_tuple(row,column -1);
        //checking left
    }
    else if(column+1 < MazeMatrix.at(row).size() && MazeMatrix.at(row).at(column + 1) == '0' && !used.at(row).at(column + 1)){
        return std::make_tuple(row,column + 1);
        //checking right.
    }
    else{
        return NoSuccessor;
    }
}